

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O2

int ppc_hash32_pp_prot(int key,int pp,int nx)

{
  uint uVar1;
  uint uVar2;
  
  if (key == 0) {
    uVar2 = (uint)((uint)pp < 3) * 2 + 1;
  }
  else {
    uVar2 = *(uint *)(&DAT_00bb8e98 + (long)pp * 4);
  }
  uVar1 = uVar2 | 4;
  if (nx != 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

static int ppc_hash32_pp_prot(int key, int pp, int nx)
{
    int prot;

    if (key == 0) {
        switch (pp) {
        case 0x0:
        case 0x1:
        case 0x2:
            prot = PAGE_READ | PAGE_WRITE;
            break;

        case 0x3:
            prot = PAGE_READ;
            break;

        default:
            abort();
        }
    } else {
        switch (pp) {
        case 0x0:
            prot = 0;
            break;

        case 0x1:
        case 0x3:
            prot = PAGE_READ;
            break;

        case 0x2:
            prot = PAGE_READ | PAGE_WRITE;
            break;

        default:
            abort();
        }
    }
    if (nx == 0) {
        prot |= PAGE_EXEC;
    }

    return prot;
}